

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::DecorationManager::HasDecoration
          (DecorationManager *this,uint32_t id,uint32_t decoration)

{
  anon_class_8_1_d60519b3 local_48;
  function<void_(const_spvtools::opt::Instruction_&)> local_40;
  bool local_19;
  uint32_t local_18;
  uint32_t uStack_14;
  bool has_decoration;
  uint32_t decoration_local;
  uint32_t id_local;
  DecorationManager *this_local;
  
  local_19 = false;
  local_48.has_decoration = &local_19;
  local_18 = decoration;
  uStack_14 = id;
  _decoration_local = this;
  std::function<void(spvtools::opt::Instruction_const&)>::
  function<spvtools::opt::analysis::DecorationManager::HasDecoration(unsigned_int,unsigned_int)const::__0,void>
            ((function<void(spvtools::opt::Instruction_const&)> *)&local_40,&local_48);
  ForEachDecoration(this,id,decoration,&local_40);
  std::function<void_(const_spvtools::opt::Instruction_&)>::~function(&local_40);
  return (bool)(local_19 & 1);
}

Assistant:

bool DecorationManager::HasDecoration(uint32_t id, uint32_t decoration) const {
  bool has_decoration = false;
  ForEachDecoration(id, decoration, [&has_decoration](const Instruction&) {
    has_decoration = true;
  });
  return has_decoration;
}